

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

int HistoQueueUpdatePair
              (VP8LHistogram *h1,VP8LHistogram *h2,int64_t cost_threshold,HistogramPair *pair)

{
  int iVar1;
  long cost_threshold_in;
  long lVar2;
  
  lVar2 = h2->bit_cost_ + h1->bit_cost_;
  cost_threshold_in = 0x7fffffffffffffff;
  if (lVar2 <= 0x7fffffffffffffff - cost_threshold) {
    cost_threshold_in = lVar2 + cost_threshold;
  }
  if (cost_threshold < 0) {
    cost_threshold_in = lVar2 + cost_threshold;
  }
  iVar1 = GetCombinedHistogramEntropy(h1,h2,cost_threshold_in,&pair->cost_combo);
  if (iVar1 != 0) {
    pair->cost_diff = pair->cost_combo - lVar2;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

WEBP_NODISCARD static int HistoQueueUpdatePair(const VP8LHistogram* const h1,
                                               const VP8LHistogram* const h2,
                                               int64_t cost_threshold,
                                               HistogramPair* const pair) {
  const int64_t sum_cost = h1->bit_cost_ + h2->bit_cost_;
  SaturateAdd(sum_cost, &cost_threshold);
  if (!GetCombinedHistogramEntropy(h1, h2, cost_threshold, &pair->cost_combo)) {
    return 0;
  }
  pair->cost_diff = (int64_t)pair->cost_combo - sum_cost;
  return 1;
}